

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O2

ssize_t __thiscall
twitter::zipkin::thrift::Span::read(Span *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  *this_00;
  vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  *this_01;
  undefined1 *puVar1;
  pointer pBVar2;
  pointer pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  TProtocol *this_02;
  long lVar8;
  uint32_t _size12;
  int16_t fid;
  TType _etype15;
  TType ftype;
  string fname;
  uint local_ac;
  Span *local_a8;
  ushort local_9a;
  undefined1 local_98 [4];
  int local_94;
  int64_t *local_90;
  string *local_88;
  int64_t *local_80;
  int64_t *local_78;
  bool *local_70;
  int64_t *local_68;
  int64_t *local_60;
  int64_t *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_02 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_02);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar4 = (*this_02->_vptr_TProtocol[0x19])(this_02,&local_50);
  local_58 = &this->trace_id_high;
  local_60 = &this->duration;
  local_68 = &this->timestamp;
  local_70 = &this->debug;
  this_00 = &this->binary_annotations;
  this_01 = &this->annotations;
  local_78 = &this->parent_id;
  local_80 = &this->id;
  local_88 = &this->name;
  local_90 = &this->trace_id;
  local_a8 = this;
  do {
    iVar5 = (*this_02->_vptr_TProtocol[0x1b])(this_02,&local_50,&local_94,&local_9a);
    iVar5 = iVar5 + iVar4;
    if (local_94 == 0) {
      iVar4 = (*this_02->_vptr_TProtocol[0x1a])(this_02);
      std::__cxx11::string::~string((string *)&local_50);
      this_02->input_recursion_depth_ = this_02->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar5);
    }
    switch(local_9a) {
    case 1:
      if (local_94 != 10) {
        iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
        break;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_90);
      iVar6 = iVar6 + iVar5;
      *(byte *)&local_a8->__isset = *(byte *)&local_a8->__isset | 1;
      goto LAB_0023a8ec;
    default:
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 3:
      if (local_94 == 0xb) {
        iVar6 = (*this_02->_vptr_TProtocol[0x2a])(this_02,local_88);
        iVar6 = iVar6 + iVar5;
        *(byte *)&local_a8->__isset = *(byte *)&local_a8->__isset | 2;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 4:
      if (local_94 == 10) {
        iVar6 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_80);
        iVar6 = iVar6 + iVar5;
        *(byte *)&local_a8->__isset = *(byte *)&local_a8->__isset | 4;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 5:
      if (local_94 == 10) {
        iVar6 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_78);
        iVar6 = iVar6 + iVar5;
        *(byte *)&local_a8->__isset = *(byte *)&local_a8->__isset | 8;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 6:
      if (local_94 == 0xf) {
        std::
        vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
        ::clear(this_01);
        iVar4 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_98,&local_ac);
        std::
        vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
        ::resize(this_01,(ulong)local_ac);
        iVar4 = iVar4 + iVar5;
        lVar8 = 0;
        for (uVar7 = 0; uVar7 < local_ac; uVar7 = uVar7 + 1) {
          pAVar3 = (this_01->
                   super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar5 = (**(code **)(*(long *)(&pAVar3->field_0x0 + lVar8) + 0x10))
                            (&pAVar3->field_0x0 + lVar8,this_02);
          iVar4 = iVar4 + iVar5;
          lVar8 = lVar8 + 0x90;
        }
        iVar6 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar6 = iVar6 + iVar4;
        *(byte *)&local_a8->__isset = *(byte *)&local_a8->__isset | 0x10;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 8:
      if (local_94 == 0xf) {
        std::
        vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
        ::clear(this_00);
        iVar4 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_98,&local_ac);
        std::
        vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
        ::resize(this_00,(ulong)local_ac);
        iVar4 = iVar4 + iVar5;
        lVar8 = 0;
        for (uVar7 = 0; uVar7 < local_ac; uVar7 = uVar7 + 1) {
          pBVar2 = (this_00->
                   super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar5 = (**(code **)(*(long *)(&pBVar2->field_0x0 + lVar8) + 0x10))
                            (&pBVar2->field_0x0 + lVar8,this_02);
          iVar4 = iVar4 + iVar5;
          lVar8 = lVar8 + 0xb0;
        }
        iVar6 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar6 = iVar6 + iVar4;
        *(byte *)&local_a8->__isset = *(byte *)&local_a8->__isset | 0x20;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 9:
      if (local_94 == 2) {
        iVar6 = (*this_02->_vptr_TProtocol[0x23])(this_02,local_70);
        iVar6 = iVar6 + iVar5;
        *(byte *)&local_a8->__isset = *(byte *)&local_a8->__isset | 0x40;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 10:
      if (local_94 == 10) {
        iVar6 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_68);
        iVar6 = iVar6 + iVar5;
        *(byte *)&local_a8->__isset = *(byte *)&local_a8->__isset | 0x80;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 0xb:
      if (local_94 == 10) {
        iVar6 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_60);
        iVar6 = iVar6 + iVar5;
        puVar1 = &(local_a8->__isset).field_0x1;
        *puVar1 = *puVar1 | 1;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 0xc:
      if (local_94 == 10) {
        iVar6 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_58);
        iVar6 = iVar6 + iVar5;
        puVar1 = &(local_a8->__isset).field_0x1;
        *puVar1 = *puVar1 | 2;
        goto LAB_0023a8ec;
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
    }
    iVar6 = iVar6 + iVar5;
LAB_0023a8ec:
    iVar4 = (*this_02->_vptr_TProtocol[0x1c])(this_02);
    iVar4 = iVar4 + iVar6;
  } while( true );
}

Assistant:

uint32_t Span::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->trace_id);
          this->__isset.trace_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->name);
          this->__isset.name = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->id);
          this->__isset.id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->parent_id);
          this->__isset.parent_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->annotations.clear();
            uint32_t _size7;
            ::apache::thrift::protocol::TType _etype10;
            xfer += iprot->readListBegin(_etype10, _size7);
            this->annotations.resize(_size7);
            uint32_t _i11;
            for (_i11 = 0; _i11 < _size7; ++_i11)
            {
              xfer += this->annotations[_i11].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.annotations = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->binary_annotations.clear();
            uint32_t _size12;
            ::apache::thrift::protocol::TType _etype15;
            xfer += iprot->readListBegin(_etype15, _size12);
            this->binary_annotations.resize(_size12);
            uint32_t _i16;
            for (_i16 = 0; _i16 < _size12; ++_i16)
            {
              xfer += this->binary_annotations[_i16].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.binary_annotations = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->debug);
          this->__isset.debug = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->timestamp);
          this->__isset.timestamp = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 11:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->duration);
          this->__isset.duration = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 12:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->trace_id_high);
          this->__isset.trace_id_high = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}